

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp4::sPolynomial5
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x226];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x227];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x244] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x23f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x240] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x25d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[600] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x259] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x276] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x271] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x272] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x28f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x28a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x28b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2a8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2a3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2a4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2c1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[700] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2bd] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2da] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2d5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2d6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2f3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2ee] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2ef] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x30c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x307] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x308] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x325] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[800] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x321] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x33e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x339] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x33a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x357] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x352] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x353] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x370] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x36b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x36c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x389] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[900] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x385] / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::sPolynomial5( Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  groebnerMatrix(5,23) = (groebnerMatrix(0,23)/(groebnerMatrix(0,22))-groebnerMatrix(1,23)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,24) = (groebnerMatrix(0,24)/(groebnerMatrix(0,22))-groebnerMatrix(1,24)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,25) = (groebnerMatrix(0,25)/(groebnerMatrix(0,22))-groebnerMatrix(1,25)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,26) = (groebnerMatrix(0,26)/(groebnerMatrix(0,22))-groebnerMatrix(1,26)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,27) = (groebnerMatrix(0,27)/(groebnerMatrix(0,22))-groebnerMatrix(1,27)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,28) = (groebnerMatrix(0,28)/(groebnerMatrix(0,22))-groebnerMatrix(1,28)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,29) = (groebnerMatrix(0,29)/(groebnerMatrix(0,22))-groebnerMatrix(1,29)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,30) = (groebnerMatrix(0,30)/(groebnerMatrix(0,22))-groebnerMatrix(1,30)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,31) = (groebnerMatrix(0,31)/(groebnerMatrix(0,22))-groebnerMatrix(1,31)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,32) = (groebnerMatrix(0,32)/(groebnerMatrix(0,22))-groebnerMatrix(1,32)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,33) = (groebnerMatrix(0,33)/(groebnerMatrix(0,22))-groebnerMatrix(1,33)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,34) = (groebnerMatrix(0,34)/(groebnerMatrix(0,22))-groebnerMatrix(1,34)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,35) = (groebnerMatrix(0,35)/(groebnerMatrix(0,22))-groebnerMatrix(1,35)/(groebnerMatrix(1,22)));
  groebnerMatrix(5,36) = (groebnerMatrix(0,36)/(groebnerMatrix(0,22))-groebnerMatrix(1,36)/(groebnerMatrix(1,22)));
}